

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_curse(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  char *__s1;
  void *pvVar4;
  uint local_30;
  wchar_t i;
  wchar_t power;
  char *s;
  artifact *a;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  __s1 = parser_getsym(p,"name");
  wVar1 = parser_getint(p,"power");
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    local_30 = 1;
    while (((int)local_30 < (int)(uint)z_info->curse_max &&
           (iVar2 = strcmp(__s1,curses[(int)local_30].name), iVar2 != 0))) {
      local_30 = local_30 + 1;
    }
    if (local_30 == z_info->curse_max) {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_CURSE;
    }
    else {
      if (L'\0' < wVar1) {
        if (*(long *)((long)pvVar3 + 0xe8) == 0) {
          pvVar4 = mem_zalloc((ulong)z_info->curse_max << 2);
          *(void **)((long)pvVar3 + 0xe8) = pvVar4;
        }
        *(wchar_t *)(*(long *)((long)pvVar3 + 0xe8) + (long)(int)local_30 * 4) = wVar1;
      }
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_artifact_curse(struct parser *p) {
	struct artifact *a = parser_priv(p);
	const char *s = parser_getsym(p, "name");
	int power = parser_getint(p, "power");
	int i;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->curse_max; i++) {
		if (streq(s, curses[i].name)) break;
	}
	if (i == z_info->curse_max) {
		return PARSE_ERROR_UNRECOGNISED_CURSE;
	}
	/* Only add if it has power. */
	if (power > 0) {
		if (!a->curses) {
			a->curses = mem_zalloc(z_info->curse_max * sizeof(int));
		}
		a->curses[i] = power;
	}
	return PARSE_ERROR_NONE;
}